

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O2

int zt_opt_usage(char *name,char *help,zt_opt_def_t *opts)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = "";
  if (help != (char *)0x0) {
    pcVar2 = help;
  }
  printf("Usage: %s %s\nOptions:\n",name,pcVar2);
  do {
    if (opts->cb == (zt_opt_callback)0x0) {
      return 0;
    }
    iVar1 = _zt_opt_help_stdout_printer(opts);
    opts = opts + 1;
  } while (-1 < iVar1);
  return -1;
}

Assistant:

int
zt_opt_usage(const char * name, const char * help, zt_opt_def_t * opts) {
    int i;

    printf("Usage: %s %s\nOptions:\n", name, help ? help : "");

    for (i = 0; opts[i].cb != NULL; i++) {
        if (_zt_opt_help_stdout_printer(&opts[i]) < 0) {
            return -1;
        }
    }

    return 0;
}